

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O2

void FindRulePrecedences(lemon *xp)

{
  rule *prVar1;
  symbol *psVar2;
  uint uVar3;
  ulong uVar4;
  symbol *psVar5;
  rule **pprVar6;
  ulong uVar7;
  ulong uVar8;
  
  pprVar6 = &xp->rule;
  do {
    prVar1 = *pprVar6;
    if (prVar1 == (rule *)0x0) {
      return;
    }
    if (prVar1->precsym == (symbol *)0x0) {
      uVar3 = prVar1->nrhs;
      if (prVar1->nrhs < 1) {
        uVar3 = 0;
      }
      psVar5 = (symbol *)0x0;
      uVar4 = 0;
      while ((uVar4 != uVar3 && (psVar5 == (symbol *)0x0))) {
        psVar2 = prVar1->rhs[uVar4];
        if (psVar2->type == MULTITERMINAL) {
          uVar7 = (ulong)(uint)psVar2->nsubsym;
          if (psVar2->nsubsym < 1) {
            uVar7 = 0;
          }
          uVar8 = 0;
          do {
            if (uVar7 == uVar8) goto LAB_00102873;
            psVar5 = psVar2->subsym[uVar8];
            uVar8 = uVar8 + 1;
          } while (psVar5->prec < 0);
LAB_0010286d:
          prVar1->precsym = psVar5;
        }
        else {
          psVar5 = psVar2;
          if (-1 < psVar2->prec) goto LAB_0010286d;
LAB_00102873:
          psVar5 = (symbol *)0x0;
        }
        uVar4 = uVar4 + 1;
      }
    }
    pprVar6 = &prVar1->next;
  } while( true );
}

Assistant:

void FindRulePrecedences(struct lemon *xp)
{
  struct rule *rp;
  for(rp=xp->rule; rp; rp=rp->next){
    if( rp->precsym==0 ){
      int i, j;
      for(i=0; i<rp->nrhs && rp->precsym==0; i++){
        struct symbol *sp = rp->rhs[i];
        if( sp->type==MULTITERMINAL ){
          for(j=0; j<sp->nsubsym; j++){
            if( sp->subsym[j]->prec>=0 ){
              rp->precsym = sp->subsym[j];
              break;
            }
          }
        }else if( sp->prec>=0 ){
          rp->precsym = rp->rhs[i];
        }
      }
    }
  }
  return;
}